

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::ScanLineInputFile::rawPixelDataToBuffer
          (ScanLineInputFile *this,int scanLine,char *pixelData,int *pixelDataSize)

{
  pthread_mutex_t *__mutex;
  Data *ifd;
  int iVar1;
  ArgExc *pAVar2;
  stringstream _iex_replace_s;
  char *local_1b8 [50];
  
  local_1b8[0] = pixelData;
  if (this->_data->memoryMapped == true) {
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar2,
               "Reading raw pixel data to a buffer is not supported for memory mapped streams.");
    __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    ifd = this->_data;
    if ((ifd->minY <= scanLine) && (scanLine <= ifd->maxY)) {
      anon_unknown_7::readPixelData(this->_streamData,ifd,scanLine,local_1b8,pixelDataSize);
      pthread_mutex_unlock(__mutex);
      return;
    }
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar2,"Tried to read scan line outside the image file\'s data window.")
    ;
    __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ScanLineInputFile::rawPixelDataToBuffer(int scanLine,
                                             char *pixelData,
                                             int &pixelDataSize) const
{
  if (_data->memoryMapped) {
    throw IEX_NAMESPACE::ArgExc ("Reading raw pixel data to a buffer "
                                 "is not supported for memory mapped "
                                 "streams." );
  }

  try 
  {
    Lock lock (*_streamData);
    
    if (scanLine < _data->minY || scanLine > _data->maxY) 
    {
      throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                                   "the image file's data window.");
    }
    
    readPixelData
      (_streamData, _data, scanLine, pixelData, pixelDataSize);
    
  }
  catch (IEX_NAMESPACE::BaseExc &e) 
  {
    REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
    throw;
  }
}